

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O1

void __thiscall Liby::EventQueue::wakeup(EventQueue *this)

{
  write(this->eventfd_,&wakeup::this_is_a_number,8);
  return;
}

Assistant:

void EventQueue::wakeup() {
    static int64_t this_is_a_number = 1;
    int targetfd;
#ifdef __linux__
    targetfd = eventfd_;
#elif defined(__APPLE__)
    targetfd = event2fd_;
#endif
    ClearUnuseVariableWarning(
        ::write(targetfd, &this_is_a_number, sizeof(this_is_a_number)));
}